

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_MessageCreate(hrgls_Message *returnMessage)

{
  hrgls_Message_ *this;
  hrgls_Message ret;
  hrgls_Status s;
  hrgls_Message *returnMessage_local;
  
  this = (hrgls_Message_ *)operator_new(0x38);
  hrgls_Message_::hrgls_Message_(this);
  *returnMessage = this;
  return 0;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageCreate(hrgls_Message *returnMessage)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  hrgls_Message ret;
	  try {
		  ret = new hrgls_Message_;
	  } catch (...) {
		  s = hrgls_STATUS_OUT_OF_MEMORY;
		  ret = nullptr;
	  }
	  *returnMessage = ret;
	  return s;
  }